

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,BoundedZCIS input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  ParseFlags parse_flags_00;
  ParseContext *ctx_00;
  undefined1 local_b0 [8];
  ParseContext ctx;
  BoundedZCIS input_local;
  char *ptr;
  
  ctx_00 = input._8_8_;
  input_local.zcis._0_4_ = input.zcis._0_4_;
  ctx.data_.factory = (MessageFactory *)this;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            ((ParseContext *)local_b0,io::CodedInputStream::default_recursion_limit_,true,
             (char **)&input_local.limit,(ZeroCopyInputStream **)&ctx.data_.factory,
             (int *)&input_local);
  input_local._8_8_ =
       (**(code **)((ctx_00->super_EpsCopyInputStream).limit_end_ + 0x58))
                 (ctx_00,input_local._8_8_,(ParseContext *)local_b0);
  if (((char *)input_local._8_8_ != (char *)0x0) &&
     (EpsCopyInputStream::BackUp((EpsCopyInputStream *)local_b0,(char *)input_local._8_8_),
     (int)ctx.super_EpsCopyInputStream.aliasing_ == 0)) {
    bVar1 = anon_unknown_17::CheckFieldPresence
                      (ctx_00,(MessageLite *)((ulong)msg & 0xffffffff),parse_flags_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (PROTOBUF_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}